

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

size_t Catch::listTags(Config *config)

{
  string *__return_storage_ptr__;
  pointer *this;
  _Base_ptr p_Var1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestSpecParser *this_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  pointer pTVar3;
  iterator iVar4;
  _Rb_tree_node_base *p_Var5;
  ostream *poVar6;
  _Base_ptr p_Var7;
  size_t *psVar8;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_bool>
  pVar9;
  undefined1 local_2d0 [8];
  ostringstream oss;
  string local_158 [32];
  undefined1 local_138 [8];
  Text wrapper;
  TestSpec testSpec;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  tagCounts;
  string tagName;
  string lcaseTagName;
  
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             &wrapper.lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar2));
  iVar2 = (*(config->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable
            ._vptr_NonCopyable[0xd])(config);
  if (*(long *)CONCAT44(extraout_var_00,iVar2) == ((long *)CONCAT44(extraout_var_00,iVar2))[1]) {
    std::operator<<((ostream *)&std::cout,"All available tags:\n");
    TagAliasRegistry::get();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_138,"*",
               (allocator<char> *)&tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count);
    this_00 = TestSpecParser::parse((TestSpecParser *)local_2d0,(string *)local_138);
    TestSpecParser::testSpec
              ((TestSpec *)
               &matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,this_00);
    this = &matchedTestCases.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::_M_move_assign
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &wrapper.lines.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)this);
    std::__cxx11::string::~string((string *)local_138);
    TestSpecParser::~TestSpecParser((TestSpecParser *)local_2d0);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Tags for matching test cases:\n");
  }
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&tagCounts;
  tagCounts._M_t._M_impl._0_4_ = 0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  testCases = getAllTestCasesSorted((IConfig *)config);
  filterTests((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              &testSpec.m_filters.
               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,testCases,
              (TestSpec *)
              &wrapper.lines.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,(IConfig *)config);
  __return_storage_ptr__ = (string *)(&tagName.field_2._M_allocated_capacity + 1);
  for (pTVar3 = (pointer)testSpec.m_filters.
                         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pTVar3 != matchedTestCases.
                super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar3 = pTVar3 + 1) {
    for (p_Var5 = (pTVar3->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left; psVar8 = &tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count,
        (_Rb_tree_header *)p_Var5 !=
        &(pTVar3->super_TestCaseInfo).tags._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      std::__cxx11::string::string((string *)psVar8,(string *)(p_Var5 + 1));
      toLower(__return_storage_ptr__,(string *)psVar8);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
                      *)&matchedTestCases.
                         super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage,__return_storage_ptr__);
      if (iVar4._M_node == (_Base_ptr)&tagCounts) {
        wrapper.str._M_dataplus._M_p._0_4_ = 0;
        wrapper.str._M_string_length = 0;
        wrapper.str.field_2._M_allocated_capacity = (size_type)&wrapper;
        wrapper.attr.initialIndent = 0;
        wrapper.attr.indent = 0;
        wrapper.str.field_2._8_8_ = wrapper.str.field_2._M_allocated_capacity;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Catch::TagInfo,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                    *)local_2d0,__return_storage_ptr__,(TagInfo *)local_138);
        pVar9 = std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                ::_M_emplace_unique<std::pair<std::__cxx11::string,Catch::TagInfo>>
                          ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Catch::TagInfo>,std::_Select1st<std::pair<std::__cxx11::string_const,Catch::TagInfo>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Catch::TagInfo>>>
                            *)&matchedTestCases.
                               super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                            *)local_2d0);
        iVar4._M_node = (_Base_ptr)pVar9.first._M_node;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>
                 *)local_2d0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_138);
      }
      psVar8 = &tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count;
      TagInfo::add((TagInfo *)(iVar4._M_node + 2),(string *)psVar8);
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)psVar8);
    }
  }
  psVar8 = &tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count;
  for (p_Var7 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var1 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right,
      p_Var7 != (_Rb_tree_node_base *)&tagCounts;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2d0);
    poVar6 = std::operator<<((ostream *)local_2d0,"  ");
    *(undefined8 *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x10) = 2;
    poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
    std::operator<<(poVar6,"  ");
    TagInfo::all_abi_cxx11_((string *)psVar8,(TagInfo *)(p_Var7 + 2));
    tagName.field_2._8_8_ = 0;
    std::__cxx11::stringbuf::str();
    Tbc::Text::Text((Text *)local_138,(string *)psVar8,
                    (TextAttributes *)((long)&tagName.field_2 + 8));
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string((string *)psVar8);
    std::__cxx11::stringbuf::str();
    poVar6 = std::operator<<((ostream *)&std::cout,(string *)psVar8);
    poVar6 = Tbc::operator<<(poVar6,(Text *)local_138);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)psVar8);
    Tbc::Text::~Text((Text *)local_138);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2d0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"tag",
             (allocator<char> *)&tagCounts._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_2d0 = (undefined1  [8])p_Var1;
  std::__cxx11::string::string((string *)&oss,(string *)local_138);
  operator<<((ostream *)&std::cout,(pluralise *)local_2d0);
  poVar6 = std::operator<<((ostream *)&std::cout,"\n");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::string::~string((string *)local_138);
  p_Var7 = tagCounts._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
             &testSpec.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::TagInfo>_>_>
               *)&matchedTestCases.
                  super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             &wrapper.lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (size_t)p_Var7;
}

Assistant:

inline std::size_t listTags( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        if( config.testSpec().hasFilters() )
            Catch::cout() << "Tags for matching test cases:\n";
        else {
            Catch::cout() << "All available tags:\n";
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "*" ).testSpec();
        }

        std::map<std::string, TagInfo> tagCounts;

        std::vector<TestCase> matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        for( std::vector<TestCase>::const_iterator it = matchedTestCases.begin(), itEnd = matchedTestCases.end();
                it != itEnd;
                ++it ) {
            for( std::set<std::string>::const_iterator  tagIt = it->getTestCaseInfo().tags.begin(),
                                                        tagItEnd = it->getTestCaseInfo().tags.end();
                    tagIt != tagItEnd;
                    ++tagIt ) {
                std::string tagName = *tagIt;
                std::string lcaseTagName = toLower( tagName );
                std::map<std::string, TagInfo>::iterator countIt = tagCounts.find( lcaseTagName );
                if( countIt == tagCounts.end() )
                    countIt = tagCounts.insert( std::make_pair( lcaseTagName, TagInfo() ) ).first;
                countIt->second.add( tagName );
            }
        }

        for( std::map<std::string, TagInfo>::const_iterator countIt = tagCounts.begin(),
                                                            countItEnd = tagCounts.end();
                countIt != countItEnd;
                ++countIt ) {
            std::ostringstream oss;
            oss << "  " << std::setw(2) << countIt->second.count << "  ";
            Text wrapper( countIt->second.all(), TextAttributes()
                                                    .setInitialIndent( 0 )
                                                    .setIndent( oss.str().size() )
                                                    .setWidth( CATCH_CONFIG_CONSOLE_WIDTH-10 ) );
            Catch::cout() << oss.str() << wrapper << "\n";
        }
        Catch::cout() << pluralise( tagCounts.size(), "tag" ) << "\n" << std::endl;
        return tagCounts.size();
    }